

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::generateGOST
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pPublicKeyTemplate,
          CK_ULONG ulPublicKeyAttributeCount,CK_ATTRIBUTE_PTR pPrivateKeyTemplate,
          CK_ULONG ulPrivateKeyAttributeCount,CK_OBJECT_HANDLE_PTR phPublicKey,
          CK_OBJECT_HANDLE_PTR phPrivateKey,CK_BBOOL isPublicKeyOnToken,CK_BBOOL isPublicKeyPrivate,
          CK_BBOOL isPrivateKeyOnToken,CK_BBOOL isPrivateKeyPrivate)

{
  _func_int **pp_Var1;
  Token *pTVar2;
  long *plVar3;
  char cVar4;
  byte bVar5;
  int iVar6;
  Session *this_00;
  size_t sVar7;
  CryptoFactory *pCVar8;
  undefined4 extraout_var;
  ulong uVar9;
  long *plVar10;
  char *pcVar11;
  ByteString *pBVar12;
  CK_ULONG CVar13;
  CK_ULONG CVar14;
  CK_ATTRIBUTE_PTR p_Var15;
  SoftHSM *pSVar16;
  unsigned_long *puVar17;
  CK_RV CVar18;
  bool bVar19;
  ByteString local_res58;
  ByteString param_c;
  ByteString param_b;
  ByteString param_a;
  ByteString value;
  ByteString local_res120;
  ByteString local_res148;
  CK_KEY_TYPE privateKeyType;
  CK_OBJECT_CLASS privateKeyClass;
  ECParameters p;
  ByteString point;
  CK_KEY_TYPE publicKeyType;
  CK_OBJECT_CLASS publicKeyClass;
  CK_ATTRIBUTE publicKeyAttribs [32];
  long *local_a80;
  long *local_a78;
  Token *local_a70;
  CK_SESSION_HANDLE local_a68;
  SoftHSM *local_a60;
  CK_ULONG local_a58;
  long *local_a50;
  long *local_a48;
  CK_ATTRIBUTE_PTR local_a40;
  CK_ULONG local_a38;
  ByteString local_a30;
  ByteString local_a08;
  ByteString local_9e0;
  ByteString local_9b8;
  ByteString local_990;
  ByteString local_968;
  ByteString local_940;
  undefined1 local_918 [8];
  undefined1 local_910 [8];
  ECParameters local_908;
  undefined1 local_8d8 [160];
  OSAttribute local_838;
  OSAttribute local_798;
  OSAttribute local_6f8;
  OSAttribute local_658;
  OSAttribute local_5b8;
  OSAttribute local_518;
  OSAttribute local_478;
  OSAttribute local_3d8;
  ByteString local_338;
  undefined8 local_310;
  undefined8 local_308;
  CK_BBOOL *local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  OSAttribute *local_2e8;
  undefined8 local_2e0;
  
  *phPublicKey = 0;
  *phPrivateKey = 0;
  local_a40 = pPrivateKeyTemplate;
  local_a38 = ulPrivateKeyAttributeCount;
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    CVar18 = 0xb3;
  }
  else {
    local_a70 = Session::getToken(this_00);
    if (local_a70 == (Token *)0x0) {
      CVar18 = 5;
    }
    else {
      ByteString::ByteString(&local_940);
      ByteString::ByteString(&local_a30);
      local_a68 = hSession;
      local_a60 = this;
      ByteString::ByteString(&local_968);
      local_a58 = ulPublicKeyAttributeCount;
      if (ulPublicKeyAttributeCount != 0) {
        puVar17 = &pPublicKeyTemplate->ulValueLen;
        do {
          sVar7 = ((_CK_ATTRIBUTE *)(puVar17 + -2))->type;
          if (sVar7 == 0x252) {
            ByteString::ByteString(&local_338,(uchar *)puVar17[-1],*puVar17);
            ByteString::operator=(&local_968,&local_338);
LAB_0013fe26:
            local_338._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
            std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                      (&local_338.byteString.
                        super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
          }
          else {
            if (sVar7 == 0x251) {
              ByteString::ByteString(&local_338,(uchar *)puVar17[-1],*puVar17);
              ByteString::operator=(&local_a30,&local_338);
              goto LAB_0013fe26;
            }
            if (sVar7 == 0x250) {
              ByteString::ByteString(&local_338,(uchar *)puVar17[-1],*puVar17);
              ByteString::operator=(&local_940,&local_338);
              goto LAB_0013fe26;
            }
          }
          puVar17 = puVar17 + 3;
          ulPublicKeyAttributeCount = ulPublicKeyAttributeCount - 1;
        } while (ulPublicKeyAttributeCount != 0);
      }
      sVar7 = ByteString::size(&local_940);
      if ((sVar7 == 0) || (sVar7 = ByteString::size(&local_a30), sVar7 == 0)) {
        CVar18 = 0xd0;
        softHSMLog(6,"generateGOST",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0x2759,"Missing parameter(s) in pPublicKeyTemplate");
      }
      else {
        local_908.super_AsymmetricParameters.super_Serialisable._vptr_Serialisable =
             (Serialisable)&PTR_serialise_0019d6c0;
        ByteString::ByteString(&local_908.ec);
        ECParameters::setEC(&local_908,&local_940);
        local_a80 = (long *)0x0;
        pCVar8 = CryptoFactory::i();
        iVar6 = (*pCVar8->_vptr_CryptoFactory[2])(pCVar8,6);
        plVar10 = (long *)CONCAT44(extraout_var,iVar6);
        CVar18 = 5;
        if (plVar10 != (long *)0x0) {
          cVar4 = (**(code **)(*plVar10 + 0x60))(plVar10,&local_a80,&local_908,0);
          if (cVar4 == '\0') {
            softHSMLog(3,"generateGOST",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                       ,0x2767,"Could not generate key pair");
            pCVar8 = CryptoFactory::i();
            (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,plVar10);
          }
          else {
            local_a48 = (long *)(**(code **)(*local_a80 + 0x18))();
            local_a78 = plVar10;
            local_a50 = (long *)(**(code **)(*local_a80 + 0x28))();
            local_6f8._vptr_OSAttribute = (_func_int **)0x2;
            local_798._vptr_OSAttribute = (_func_int **)0x30;
            memset(&local_338,0,0x300);
            pSVar16 = local_a60;
            local_338.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x8;
            local_338.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
            local_338.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = &isPublicKeyOnToken;
            local_310 = 1;
            local_308 = 2;
            local_300 = &isPublicKeyPrivate;
            local_2f8 = 1;
            local_2f0 = 0x100;
            CVar18 = 0xd1;
            if (local_a58 < 0x1d) {
              CVar18 = 0;
            }
            local_2e0 = 8;
            CVar13 = 4;
            uVar9 = 1;
            CVar14 = CVar13;
            if (local_a58 - 1 < 0x1c) {
              do {
                CVar13 = CVar14;
                if ((2 < pPublicKeyTemplate->type) && (pPublicKeyTemplate->type != 0x100)) {
                  CVar13 = CVar14 + 1;
                  (&local_338.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data)[CVar14]._M_start =
                       (pointer)pPublicKeyTemplate->ulValueLen;
                  pp_Var1 = (_func_int **)pPublicKeyTemplate->pValue;
                  (&local_338._vptr_ByteString)[CVar14 * 3] = (_func_int **)pPublicKeyTemplate->type
                  ;
                  (&local_338.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                    super__Tp_alloc_type)[CVar14 * 3]._vptr_SecureAllocator = pp_Var1;
                }
                if (0x1c < local_a58) break;
                pPublicKeyTemplate = pPublicKeyTemplate + 1;
                bVar19 = uVar9 < local_a58;
                uVar9 = uVar9 + 1;
                CVar14 = CVar13;
              } while (bVar19);
            }
            local_338.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
            _M_impl.super__Tp_alloc_type._vptr_SecureAllocator = (_func_int **)&local_6f8;
            local_2e8 = &local_798;
            if (local_a58 < 0x1d) {
              CVar18 = CreateObject(local_a60,local_a68,(CK_ATTRIBUTE_PTR)&local_338,CVar13,
                                    phPublicKey,4);
            }
            if (CVar18 == 0) {
              plVar10 = (long *)HandleManager::getObject(pSVar16->handleManager,*phPublicKey);
              CVar18 = 6;
              if (((plVar10 != (long *)0x0) &&
                  (cVar4 = (**(code **)(*plVar10 + 0x50))(plVar10), cVar4 != '\0')) &&
                 (cVar4 = (**(code **)(*plVar10 + 0x58))(plVar10), cVar4 != '\0')) {
                OSAttribute::OSAttribute(&local_838,true);
                cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x163,&local_838);
                pTVar2 = local_a70;
                OSAttribute::~OSAttribute(&local_838);
                if (cVar4 == '\0') {
                  cVar4 = '\0';
                }
                else {
                  OSAttribute::OSAttribute(&local_838,0x1040);
                  cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x166,&local_838);
                  OSAttribute::~OSAttribute(&local_838);
                }
                ByteString::ByteString((ByteString *)local_8d8);
                if (isPublicKeyPrivate == '\0') {
                  pBVar12 = (ByteString *)(**(code **)(*local_a48 + 0x40))();
                  ByteString::operator=((ByteString *)local_8d8,pBVar12);
                }
                else {
                  pcVar11 = (char *)(**(code **)(*local_a48 + 0x40))();
                  Token::encrypt(pTVar2,pcVar11,(int)local_8d8);
                }
                if (cVar4 == '\0') {
                  cVar4 = '\0';
                }
                else {
                  OSAttribute::OSAttribute(&local_3d8,(ByteString *)local_8d8);
                  cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x11,&local_3d8);
                  OSAttribute::~OSAttribute(&local_3d8);
                }
                if (cVar4 == '\0') {
                  (**(code **)(*plVar10 + 0x68))(plVar10);
                  cVar4 = '\0';
                }
                else {
                  cVar4 = (**(code **)(*plVar10 + 0x60))(plVar10);
                }
                CVar18 = 6;
                if (cVar4 != '\0') {
                  CVar18 = 0;
                }
                local_8d8._0_8_ = &PTR__ByteString_0019f880;
                std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                          ((_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> *)
                           (local_8d8 + 8));
              }
            }
            if (CVar18 == 0) {
              local_910 = (undefined1  [8])0x3;
              local_918 = (undefined1  [8])0x30;
              memset(&local_338,0,0x300);
              pSVar16 = local_a60;
              local_338.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x8;
              local_338.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x1;
              local_338.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = &isPrivateKeyOnToken;
              local_310 = 1;
              local_308 = 2;
              local_300 = &isPrivateKeyPrivate;
              local_2f8 = 1;
              local_2f0 = 0x100;
              CVar18 = 0xd1;
              if (local_a38 < 0x1d) {
                CVar18 = 0;
              }
              local_2e0 = 8;
              CVar13 = 4;
              uVar9 = 1;
              CVar14 = CVar13;
              p_Var15 = local_a40;
              if (local_a38 - 1 < 0x1c) {
                do {
                  CVar13 = CVar14;
                  if ((2 < p_Var15->type) && (p_Var15->type != 0x100)) {
                    CVar13 = CVar14 + 1;
                    (&local_338.byteString.
                      super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data)[CVar14]._M_start = (pointer)p_Var15->ulValueLen;
                    pp_Var1 = (_func_int **)p_Var15->pValue;
                    (&local_338._vptr_ByteString)[CVar14 * 3] = (_func_int **)p_Var15->type;
                    (&local_338.byteString.
                      super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                      super__Tp_alloc_type)[CVar14 * 3]._vptr_SecureAllocator = pp_Var1;
                  }
                  if (0x1c < local_a38) break;
                  p_Var15 = p_Var15 + 1;
                  bVar19 = uVar9 < local_a38;
                  uVar9 = uVar9 + 1;
                  CVar14 = CVar13;
                } while (bVar19);
              }
              local_338.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
              super__Tp_alloc_type._vptr_SecureAllocator = (_func_int **)local_910;
              local_2e8 = (OSAttribute *)local_918;
              if (local_a38 < 0x1d) {
                CVar18 = CreateObject(local_a60,local_a68,(CK_ATTRIBUTE_PTR)&local_338,CVar13,
                                      phPrivateKey,4);
              }
              if (CVar18 == 0) {
                plVar10 = (long *)HandleManager::getObject(pSVar16->handleManager,*phPrivateKey);
                CVar18 = 6;
                if (((plVar10 != (long *)0x0) &&
                    (cVar4 = (**(code **)(*plVar10 + 0x50))(plVar10), cVar4 != '\0')) &&
                   (cVar4 = (**(code **)(*plVar10 + 0x58))(plVar10,1), cVar4 != '\0')) {
                  OSAttribute::OSAttribute((OSAttribute *)local_8d8,true);
                  cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x163,local_8d8);
                  pTVar2 = local_a70;
                  OSAttribute::~OSAttribute((OSAttribute *)local_8d8);
                  if (cVar4 == '\0') {
                    cVar4 = '\0';
                  }
                  else {
                    OSAttribute::OSAttribute((OSAttribute *)local_8d8,0x1040);
                    cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x166,local_8d8);
                    OSAttribute::~OSAttribute((OSAttribute *)local_8d8);
                  }
                  bVar19 = (bool)(**(code **)(*plVar10 + 0x20))(plVar10,0x103,0);
                  if (cVar4 == '\0') {
                    cVar4 = '\0';
                  }
                  else {
                    OSAttribute::OSAttribute(&local_6f8,bVar19);
                    cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x165,&local_6f8);
                    OSAttribute::~OSAttribute(&local_6f8);
                  }
                  bVar5 = (**(code **)(*plVar10 + 0x20))(plVar10,0x162,0);
                  if (cVar4 == '\0') {
                    cVar4 = '\0';
                  }
                  else {
                    OSAttribute::OSAttribute(&local_798,(bool)(bVar5 ^ 1));
                    cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x164,&local_798);
                    OSAttribute::~OSAttribute(&local_798);
                  }
                  ByteString::ByteString(&local_990);
                  plVar3 = local_a50;
                  ByteString::ByteString(&local_9b8);
                  ByteString::ByteString(&local_9e0);
                  ByteString::ByteString(&local_a08);
                  if (isPrivateKeyPrivate == '\0') {
                    pBVar12 = (ByteString *)(**(code **)(*plVar3 + 0x50))(plVar3);
                    ByteString::operator=(&local_990,pBVar12);
                    pBVar12 = (ByteString *)(**(code **)(*plVar3 + 0x58))(plVar3);
                    ByteString::operator=(&local_9b8,pBVar12);
                    ByteString::operator=(&local_9e0,&local_a30);
                    ByteString::operator=(&local_a08,&local_968);
                  }
                  else {
                    pcVar11 = (char *)(**(code **)(*plVar3 + 0x50))(plVar3);
                    Token::encrypt(pTVar2,pcVar11,(int)&local_990);
                    pcVar11 = (char *)(**(code **)(*plVar3 + 0x58))(plVar3);
                    Token::encrypt(pTVar2,pcVar11,(int)&local_9b8);
                    Token::encrypt(pTVar2,(char *)&local_a30,(int)&local_9e0);
                    Token::encrypt(pTVar2,(char *)&local_968,(int)&local_a08);
                  }
                  if (cVar4 == '\0') {
                    cVar4 = '\0';
                  }
                  else {
                    OSAttribute::OSAttribute(&local_478,&local_990);
                    cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x11,&local_478);
                    OSAttribute::~OSAttribute(&local_478);
                  }
                  if (cVar4 == '\0') {
                    cVar4 = '\0';
                  }
                  else {
                    OSAttribute::OSAttribute(&local_518,&local_9b8);
                    cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x250,&local_518);
                    OSAttribute::~OSAttribute(&local_518);
                  }
                  if (cVar4 == '\0') {
                    cVar4 = '\0';
                  }
                  else {
                    OSAttribute::OSAttribute(&local_5b8,&local_9e0);
                    cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x251,&local_5b8);
                    OSAttribute::~OSAttribute(&local_5b8);
                  }
                  if (cVar4 == '\0') {
                    cVar4 = '\0';
                  }
                  else {
                    OSAttribute::OSAttribute(&local_658,&local_a08);
                    cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x252,&local_658);
                    OSAttribute::~OSAttribute(&local_658);
                  }
                  if (cVar4 == '\0') {
                    (**(code **)(*plVar10 + 0x68))(plVar10);
                    cVar4 = '\0';
                  }
                  else {
                    cVar4 = (**(code **)(*plVar10 + 0x60))(plVar10);
                  }
                  CVar18 = 6;
                  if (cVar4 != '\0') {
                    CVar18 = 0;
                  }
                  local_a08._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
                  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                            (&local_a08.byteString.
                              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                  local_9e0._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
                  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                            (&local_9e0.byteString.
                              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                  local_9b8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
                  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                            (&local_9b8.byteString.
                              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                  local_990._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
                  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                            (&local_990.byteString.
                              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                }
              }
            }
            (**(code **)(*local_a78 + 0xc0))(local_a78,local_a80);
            pCVar8 = CryptoFactory::i();
            (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,local_a78);
            if (CVar18 != 0) {
              if (*phPrivateKey != 0) {
                plVar10 = (long *)HandleManager::getObject(pSVar16->handleManager,*phPrivateKey);
                HandleManager::destroyObject(pSVar16->handleManager,*phPrivateKey);
                if (plVar10 != (long *)0x0) {
                  (**(code **)(*plVar10 + 0x70))(plVar10);
                }
                *phPrivateKey = 0;
              }
              if (*phPublicKey != 0) {
                plVar10 = (long *)HandleManager::getObject(pSVar16->handleManager,*phPublicKey);
                HandleManager::destroyObject(pSVar16->handleManager,*phPublicKey);
                if (plVar10 != (long *)0x0) {
                  (**(code **)(*plVar10 + 0x70))(plVar10);
                }
                *phPublicKey = 0;
              }
            }
          }
        }
        local_908.super_AsymmetricParameters.super_Serialisable._vptr_Serialisable =
             (Serialisable)&PTR_serialise_0019d6c0;
        local_908.ec._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  (&local_908.ec.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      }
      local_968._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_968.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      local_a30._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_a30.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      local_940._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_940.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    }
  }
  return CVar18;
}

Assistant:

CK_RV SoftHSM::generateGOST
(CK_SESSION_HANDLE hSession,
	CK_ATTRIBUTE_PTR pPublicKeyTemplate,
	CK_ULONG ulPublicKeyAttributeCount,
	CK_ATTRIBUTE_PTR pPrivateKeyTemplate,
	CK_ULONG ulPrivateKeyAttributeCount,
	CK_OBJECT_HANDLE_PTR phPublicKey,
	CK_OBJECT_HANDLE_PTR phPrivateKey,
	CK_BBOOL isPublicKeyOnToken,
	CK_BBOOL isPublicKeyPrivate,
	CK_BBOOL isPrivateKeyOnToken,
	CK_BBOOL isPrivateKeyPrivate)
{
	*phPublicKey = CK_INVALID_HANDLE;
	*phPrivateKey = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired key information
	ByteString param_3410;
	ByteString param_3411;
	ByteString param_28147;
	for (CK_ULONG i = 0; i < ulPublicKeyAttributeCount; i++)
	{
		switch (pPublicKeyTemplate[i].type)
		{
			case CKA_GOSTR3410_PARAMS:
				param_3410 = ByteString((unsigned char*)pPublicKeyTemplate[i].pValue, pPublicKeyTemplate[i].ulValueLen);
				break;
			case CKA_GOSTR3411_PARAMS:
				param_3411 = ByteString((unsigned char*)pPublicKeyTemplate[i].pValue, pPublicKeyTemplate[i].ulValueLen);
				break;
			case CKA_GOST28147_PARAMS:
				param_28147 = ByteString((unsigned char*)pPublicKeyTemplate[i].pValue, pPublicKeyTemplate[i].ulValueLen);
				break;
			default:
				break;
		}
	}

	// The parameters must be specified to be able to generate a key pair.
	if (param_3410.size() == 0 || param_3411.size() == 0) {
		INFO_MSG("Missing parameter(s) in pPublicKeyTemplate");
		return CKR_TEMPLATE_INCOMPLETE;
	}

	// Set the parameters
	ECParameters p;
	p.setEC(param_3410);

	// Generate key pair
	AsymmetricKeyPair* kp = NULL;
	AsymmetricAlgorithm* gost = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::GOST);
	if (gost == NULL) return CKR_GENERAL_ERROR;
	if (!gost->generateKeyPair(&kp, &p))
	{
		ERROR_MSG("Could not generate key pair");
		CryptoFactory::i()->recycleAsymmetricAlgorithm(gost);
		return CKR_GENERAL_ERROR;
	}

	GOSTPublicKey* pub = (GOSTPublicKey*) kp->getPublicKey();
	GOSTPrivateKey* priv = (GOSTPrivateKey*) kp->getPrivateKey();

	CK_RV rv = CKR_OK;

	// Create a public key using C_CreateObject
	if (rv == CKR_OK)
	{
		const CK_ULONG maxAttribs = 32;
		CK_OBJECT_CLASS publicKeyClass = CKO_PUBLIC_KEY;
		CK_KEY_TYPE publicKeyType = CKK_GOSTR3410;
		CK_ATTRIBUTE publicKeyAttribs[maxAttribs] = {
			{ CKA_CLASS, &publicKeyClass, sizeof(publicKeyClass) },
			{ CKA_TOKEN, &isPublicKeyOnToken, sizeof(isPublicKeyOnToken) },
			{ CKA_PRIVATE, &isPublicKeyPrivate, sizeof(isPublicKeyPrivate) },
			{ CKA_KEY_TYPE, &publicKeyType, sizeof(publicKeyType) },
		};
		CK_ULONG publicKeyAttribsCount = 4;

		// Add the additional
		if (ulPublicKeyAttributeCount > (maxAttribs - publicKeyAttribsCount))
			rv = CKR_TEMPLATE_INCONSISTENT;
		for (CK_ULONG i=0; i < ulPublicKeyAttributeCount && rv == CKR_OK; ++i)
		{
			switch (pPublicKeyTemplate[i].type)
			{
				case CKA_CLASS:
				case CKA_TOKEN:
				case CKA_PRIVATE:
				case CKA_KEY_TYPE:
					continue;
				default:
					publicKeyAttribs[publicKeyAttribsCount++] = pPublicKeyTemplate[i];
			}
		}

		if (rv == CKR_OK)
			rv = this->CreateObject(hSession,publicKeyAttribs,publicKeyAttribsCount,phPublicKey,OBJECT_OP_GENERATE);

		// Store the attributes that are being supplied by the key generation to the object
		if (rv == CKR_OK)
		{
			OSObject* osobject = (OSObject*)handleManager->getObject(*phPublicKey);
			if (osobject == NULL_PTR || !osobject->isValid()) {
				rv = CKR_FUNCTION_FAILED;
			} else if (osobject->startTransaction()) {
				bool bOK = true;

				// Common Key Attributes
				bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
				CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_EC_KEY_PAIR_GEN;
				bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

				// EC Public Key Attributes
				ByteString point;
				if (isPublicKeyPrivate)
				{
					token->encrypt(pub->getQ(), point);
				}
				else
				{
					point = pub->getQ();
				}
				bOK = bOK && osobject->setAttribute(CKA_VALUE, point);

				if (bOK)
					bOK = osobject->commitTransaction();
				else
					osobject->abortTransaction();

				if (!bOK)
					rv = CKR_FUNCTION_FAILED;
			} else
				rv = CKR_FUNCTION_FAILED;
		}
	}

	// Create a private key using C_CreateObject
	if (rv == CKR_OK)
	{
		const CK_ULONG maxAttribs = 32;
		CK_OBJECT_CLASS privateKeyClass = CKO_PRIVATE_KEY;
		CK_KEY_TYPE privateKeyType = CKK_GOSTR3410;
		CK_ATTRIBUTE privateKeyAttribs[maxAttribs] = {
			{ CKA_CLASS, &privateKeyClass, sizeof(privateKeyClass) },
			{ CKA_TOKEN, &isPrivateKeyOnToken, sizeof(isPrivateKeyOnToken) },
			{ CKA_PRIVATE, &isPrivateKeyPrivate, sizeof(isPrivateKeyPrivate) },
			{ CKA_KEY_TYPE, &privateKeyType, sizeof(privateKeyType) },
		};
		CK_ULONG privateKeyAttribsCount = 4;
		if (ulPrivateKeyAttributeCount > (maxAttribs - privateKeyAttribsCount))
			rv = CKR_TEMPLATE_INCONSISTENT;
		for (CK_ULONG i=0; i < ulPrivateKeyAttributeCount && rv == CKR_OK; ++i)
		{
			switch (pPrivateKeyTemplate[i].type)
			{
				case CKA_CLASS:
				case CKA_TOKEN:
				case CKA_PRIVATE:
				case CKA_KEY_TYPE:
					continue;
				default:
					privateKeyAttribs[privateKeyAttribsCount++] = pPrivateKeyTemplate[i];
			}
		}

		if (rv == CKR_OK)
			rv = this->CreateObject(hSession,privateKeyAttribs,privateKeyAttribsCount,phPrivateKey,OBJECT_OP_GENERATE);

		// Store the attributes that are being supplied by the key generation to the object
		if (rv == CKR_OK)
		{
			OSObject* osobject = (OSObject*)handleManager->getObject(*phPrivateKey);
			if (osobject == NULL_PTR || !osobject->isValid()) {
				rv = CKR_FUNCTION_FAILED;
			} else if (osobject->startTransaction()) {
				bool bOK = true;

				// Common Key Attributes
				bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
				CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_EC_KEY_PAIR_GEN;
				bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

				// Common Private Key Attributes
				bool bAlwaysSensitive = osobject->getBooleanValue(CKA_SENSITIVE, false);
				bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,bAlwaysSensitive);
				bool bNeverExtractable = osobject->getBooleanValue(CKA_EXTRACTABLE, false) == false;
				bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE, bNeverExtractable);

				// GOST Private Key Attributes
				ByteString value;
				ByteString param_a;
				ByteString param_b;
				ByteString param_c;
				if (isPrivateKeyPrivate)
				{
					token->encrypt(priv->getD(), value);
					token->encrypt(priv->getEC(), param_a);
					token->encrypt(param_3411, param_b);
					token->encrypt(param_28147, param_c);
				}
				else
				{
					value = priv->getD();
					param_a = priv->getEC();
					param_b = param_3411;
					param_c = param_28147;
				}
				bOK = bOK && osobject->setAttribute(CKA_VALUE, value);
				bOK = bOK && osobject->setAttribute(CKA_GOSTR3410_PARAMS, param_a);
				bOK = bOK && osobject->setAttribute(CKA_GOSTR3411_PARAMS, param_b);
				bOK = bOK && osobject->setAttribute(CKA_GOST28147_PARAMS, param_c);

				if (bOK)
					bOK = osobject->commitTransaction();
				else
					osobject->abortTransaction();

				if (!bOK)
					rv = CKR_FUNCTION_FAILED;
			} else
				  rv = CKR_FUNCTION_FAILED;
		}
	}

	// Clean up
	gost->recycleKeyPair(kp);
	CryptoFactory::i()->recycleAsymmetricAlgorithm(gost);

	// Remove keys that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phPrivateKey != CK_INVALID_HANDLE)
		{
			OSObject* ospriv = (OSObject*)handleManager->getObject(*phPrivateKey);
			handleManager->destroyObject(*phPrivateKey);
			if (ospriv) ospriv->destroyObject();
			*phPrivateKey = CK_INVALID_HANDLE;
		}

		if (*phPublicKey != CK_INVALID_HANDLE)
		{
			OSObject* ospub = (OSObject*)handleManager->getObject(*phPublicKey);
			handleManager->destroyObject(*phPublicKey);
			if (ospub) ospub->destroyObject();
			*phPublicKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}